

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.h
# Opt level: O1

string * __thiscall BigInt::to_string_abi_cxx11_(string *__return_storage_ptr__,BigInt *this)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  stringstream ss;
  char local_1b1;
  stringstream local_1b0 [16];
  long local_1a0 [2];
  long alStack_190 [12];
  ios_base local_130 [112];
  char acStack_c0 [152];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  if (this->sign == -1) {
    local_1b1 = '-';
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,&local_1b1,1);
  }
  std::ostream::_M_insert<long_long>((longlong)local_1a0);
  iVar3 = (int)((ulong)((long)(this->vector_value).
                              super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)(this->vector_value).
                             super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 3);
  if (1 < iVar3) {
    lVar4 = (ulong)(iVar3 - 2) + 1;
    do {
      *(long *)((long)alStack_190 + *(long *)(local_1a0[0] + -0x18)) = (long)base_digits;
      lVar5 = *(long *)(local_1a0[0] + -0x18);
      if (acStack_c0[lVar5 + 1] == '\0') {
        cVar2 = std::ios::widen((char)local_1a0 + (char)lVar5);
        acStack_c0[lVar5] = cVar2;
        acStack_c0[lVar5 + 1] = '\x01';
      }
      acStack_c0[lVar5] = '0';
      std::ostream::_M_insert<long_long>((longlong)local_1a0);
      lVar5 = lVar4 + -1;
      bVar1 = 0 < lVar4;
      lVar4 = lVar5;
    } while (lVar5 != 0 && bVar1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

string to_string() {
        stringstream ss;
        //!send sign
        if (sign == NEGATIVE)
            ss << '-';

        //!get the last element
        ss << (vector_value.empty() ? 0 : vector_value.back());

        //!continue from the back
        for (int i = (int) vector_value.size() - 2; i >= 0; --i)
            ss << setw(base_digits)/*!width*/ << setfill('0')/*!empty placeholder*/ << vector_value[i]/*!number*/;

        return ss.str();
    }